

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O0

uint Jupiter_strtoui_nospace_s(char *str,size_t length,int base)

{
  char cVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint local_28;
  int tval;
  uint total;
  int base_local;
  size_t length_local;
  char *str_local;
  
  local_28 = 0;
  if (length == 0) {
    return 0;
  }
  if (*str == '-') {
    uVar3 = Jupiter_strtoi_nospace(str,base);
    return uVar3;
  }
  _total = length;
  length_local = (size_t)str;
  if (*str == '+') {
    _total = length - 1;
    if (_total == 0) {
      return 0;
    }
    length_local = (size_t)(str + 1);
  }
  sVar2 = _total;
  pcVar5 = (char *)length_local;
  if (base != 0) {
    tval = base;
    if ((base == 0x10) && (*(char *)length_local == '0')) {
      if (_total - 1 == 0) {
        return 0;
      }
      pcVar5 = (char *)(length_local + 1);
      if ((*pcVar5 == 'x') || (sVar2 = _total - 1, *pcVar5 == 'X')) {
        if (_total - 2 == 0) {
          return 0;
        }
        sVar2 = _total - 2;
        pcVar5 = (char *)(length_local + 2);
      }
    }
    goto LAB_00194af9;
  }
  if (*(char *)length_local != '0') {
    tval = 10;
    goto LAB_00194af9;
  }
  if (_total - 1 == 0) {
    return 0;
  }
  cVar1 = *(char *)(length_local + 1);
  if (cVar1 == 'B') {
LAB_00194a34:
    if (_total - 2 == 0) {
      return 0;
    }
    tval = 2;
    sVar2 = _total - 2;
    pcVar5 = (char *)(length_local + 2);
  }
  else {
    if (cVar1 != 'X') {
      if (cVar1 == 'b') goto LAB_00194a34;
      if (cVar1 != 'x') {
        tval = 8;
        sVar2 = _total - 1;
        pcVar5 = (char *)(length_local + 1);
        goto LAB_00194af9;
      }
    }
    if (_total - 2 == 0) {
      return 0;
    }
    tval = 0x10;
    sVar2 = _total - 2;
    pcVar5 = (char *)(length_local + 2);
  }
LAB_00194af9:
  while( true ) {
    length_local = (size_t)pcVar5;
    _total = sVar2;
    iVar4 = Jupiter_getBase(*(uchar *)length_local,tval);
    if (iVar4 == -1) {
      return local_28;
    }
    local_28 = tval * local_28 + iVar4;
    if (_total - 1 == 0) break;
    sVar2 = _total - 1;
    pcVar5 = (char *)(length_local + 1);
  }
  return local_28;
}

Assistant:

unsigned int Jupiter_strtoui_nospace_s(const char *str, size_t length, int base)
{
	unsigned int total = 0;
	int tval;

	if (length == 0)
		return total;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
	{
		if (--length == 0)
			return total;
		++str;
	}

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;

			++str;
			switch (*str)
			{
			case 'X':
			case 'x':
				if (--length == 0)
					return total;

				++str;
				base = 16;
				break;

			case 'B':
			case 'b':
				if (--length == 0)
					return total;

				++str;
				base = 2;
				break;

			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;
			++str;
			if (*str == 'x' || *str == 'X')
			{
				if (--length == 0)
					return total;
				++str;
			}
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	return total;
}